

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

void __thiscall QFileDevicePrivate::setError(QFileDevicePrivate *this,FileError err)

{
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)(in_RDI + 0x134) = in_ESI;
  QString::clear((QString *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void QFileDevicePrivate::setError(QFileDevice::FileError err)
{
    error = err;
    errorString.clear();
}